

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O3

int Sim_UtilCountPairsOne(Extra_BitMat_t *pMat,Vec_Int_t *vSupport)

{
  int i;
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = vSupport->nSize;
  if (iVar1 < 1) {
    iVar3 = 0;
  }
  else {
    lVar6 = 1;
    iVar3 = 0;
    lVar5 = 0;
    do {
      lVar4 = lVar5 + 1;
      lVar2 = (long)iVar1;
      if (lVar4 < lVar2) {
        i = vSupport->pArray[lVar5];
        lVar5 = lVar6;
        do {
          iVar1 = Extra_BitMatrixLookup1(pMat,i,vSupport->pArray[lVar5]);
          iVar3 = iVar3 + iVar1;
          lVar5 = lVar5 + 1;
          iVar1 = vSupport->nSize;
        } while ((int)lVar5 < iVar1);
        lVar2 = (long)iVar1;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar4;
    } while (lVar4 < lVar2);
  }
  return iVar3;
}

Assistant:

int Sim_UtilCountPairsOne( Extra_BitMat_t * pMat, Vec_Int_t * vSupport )
{
    int i, k, Index1, Index2;
    int Counter = 0;
//    int Counter2;
    Vec_IntForEachEntry( vSupport, i, Index1 )
    Vec_IntForEachEntryStart( vSupport, k, Index2, Index1+1 )
        Counter += Extra_BitMatrixLookup1( pMat, i, k );
//    Counter2 = Extra_BitMatrixCountOnesUpper(pMat);
//    assert( Counter == Counter2 );
    return Counter;
}